

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pXXX_YYY.cpp
# Opt level: O0

void pXXX_YYY(void)

{
  initializer_list<int> __l;
  allocator local_99;
  undefined1 local_98 [8];
  string problem_no;
  undefined1 local_70 [8];
  string base_path;
  allocator<int> local_39;
  int local_38 [2];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  list<int,_std::allocator<int>_> files_to_run;
  
  local_38[0] = 1;
  local_38[1] = 2;
  local_30 = local_38;
  local_28 = 2;
  std::allocator<int>::allocator(&local_39);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)local_20,__l,&local_39);
  std::allocator<int>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_70,"src/codewars/easy_puzzles",
             (allocator *)(problem_no.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(problem_no.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_98,"pXXX_YYY",&local_99);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  string_in_out_testing_v2
            ((string *)local_70,(string *)local_98,(list<int,_std::allocator<int>_> *)local_20,
             pXXX_main);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::list<int,_std::allocator<int>_>::~list((list<int,_std::allocator<int>_> *)local_20);
  return;
}

Assistant:

void pXXX_YYY() {
    list<int> files_to_run = {1, 2};  // TODO: Specify which test-sets you want to run or leave empty to run all test-files found)
    const string base_path = "src/codewars/easy_puzzles";  // TODO: Change if necessary
    const string problem_no = "pXXX_YYY";
    string_in_out_testing_v2(base_path, problem_no, files_to_run, pXXX_main);
}